

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_assert.cc
# Opt level: O0

void lf::base::AssertionFailed(string *expr,string *file,long line,string *msg)

{
  ostream *poVar1;
  basic_ostream<char,_std::char_traits<char>_> *pbVar2;
  string local_48;
  string *msg_local;
  long line_local;
  string *file_local;
  string *expr_local;
  
  local_48.field_2._8_8_ = msg;
  msg_local = (string *)line;
  line_local = (long)file;
  file_local = expr;
  poVar1 = std::operator<<((ostream *)&std::cerr,"***** Internal Program Error - assertion (");
  poVar1 = std::operator<<(poVar1,(string *)file_local);
  poVar1 = std::operator<<(poVar1,") failed:\n");
  poVar1 = std::operator<<(poVar1,(string *)line_local);
  poVar1 = std::operator<<(poVar1,'(');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(long)msg_local);
  poVar1 = std::operator<<(poVar1,"): ");
  poVar1 = std::operator<<(poVar1,(string *)local_48.field_2._8_8_);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cerr,"Backtrace:\n");
  local_48._M_dataplus._M_p = (pointer)0x0;
  local_48._M_string_length = 0;
  local_48.field_2._M_allocated_capacity = 0;
  expr_local = &local_48;
  std::vector<boost::stacktrace::frame,_std::allocator<boost::stacktrace::frame>_>::vector
            ((vector<boost::stacktrace::frame,_std::allocator<boost::stacktrace::frame>_> *)
             &local_48);
  boost::stacktrace::basic_stacktrace<std::allocator<boost::stacktrace::frame>_>::init
            ((basic_stacktrace<std::allocator<boost::stacktrace::frame>_> *)&local_48,
             (EVP_PKEY_CTX *)0x0);
  pbVar2 = boost::stacktrace::operator<<
                     (poVar1,(basic_stacktrace<std::allocator<boost::stacktrace::frame>_> *)
                             &local_48);
  std::operator<<(pbVar2,'\n');
  boost::stacktrace::basic_stacktrace<std::allocator<boost::stacktrace::frame>_>::~basic_stacktrace
            ((basic_stacktrace<std::allocator<boost::stacktrace::frame>_> *)&local_48);
  abort();
}

Assistant:

void AssertionFailed(const std::string& expr, const std::string& file,
                     long line, const std::string& msg) {
  std::cerr << "***** Internal Program Error - assertion (" << expr
            << ") failed:\n"
            << file << '(' << line << "): " << msg << std::endl;  // NOLINT
  std::cerr << "Backtrace:\n" << boost::stacktrace::stacktrace() << '\n';
  std::abort();
}